

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

GlobalLogSinkSet * absl::lts_20250127::log_internal::anon_unknown_0::GlobalSinks(void)

{
  int iVar1;
  undefined8 in_RAX;
  GlobalLogSinkSet *pGVar2;
  LogSink *in_RSI;
  
  pGVar2 = (GlobalLogSinkSet *)
           CONCAT71((int7)((ulong)in_RAX >> 8),(anonymous_namespace)::GlobalSinks()::global_sinks);
  if ((anonymous_namespace)::GlobalSinks()::global_sinks == '\0') {
    pGVar2 = (GlobalLogSinkSet *)
             __cxa_guard_acquire(&(anonymous_namespace)::GlobalSinks()::global_sinks);
    if ((int)pGVar2 != 0) {
      GlobalSinks::global_sinks.impl_.space_[0x10] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x11] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x12] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x13] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x14] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x15] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x16] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x17] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x18] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x19] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1a] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1b] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1c] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1d] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1e] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0x1f] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0] = '\0';
      GlobalSinks::global_sinks.impl_.space_[1] = '\0';
      GlobalSinks::global_sinks.impl_.space_[2] = '\0';
      GlobalSinks::global_sinks.impl_.space_[3] = '\0';
      GlobalSinks::global_sinks.impl_.space_[4] = '\0';
      GlobalSinks::global_sinks.impl_.space_[5] = '\0';
      GlobalSinks::global_sinks.impl_.space_[6] = '\0';
      GlobalSinks::global_sinks.impl_.space_[7] = '\0';
      GlobalSinks::global_sinks.impl_.space_[8] = '\0';
      GlobalSinks::global_sinks.impl_.space_[9] = '\0';
      GlobalSinks::global_sinks.impl_.space_[10] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0xb] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0xc] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0xd] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0xe] = '\0';
      GlobalSinks::global_sinks.impl_.space_[0xf] = '\0';
      if ((anonymous_namespace)::GlobalLogSinkSet::GlobalLogSinkSet()::stderr_log_sink == '\0') {
        iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GlobalLogSinkSet::GlobalLogSinkSet()::
                                     stderr_log_sink);
        if (iVar1 != 0) {
          (anonymous_namespace)::GlobalLogSinkSet::GlobalLogSinkSet()::stderr_log_sink =
               &PTR__LogSink_00437e40;
          __cxa_guard_release(&(anonymous_namespace)::GlobalLogSinkSet::GlobalLogSinkSet()::
                               stderr_log_sink);
        }
      }
      GlobalLogSinkSet::AddLogSink
                ((GlobalLogSinkSet *)
                 &(anonymous_namespace)::GlobalLogSinkSet::GlobalLogSinkSet()::stderr_log_sink,
                 in_RSI);
      pGVar2 = (GlobalLogSinkSet *)
               __cxa_guard_release(&(anonymous_namespace)::GlobalSinks()::global_sinks);
      return pGVar2;
    }
  }
  return pGVar2;
}

Assistant:

GlobalLogSinkSet& GlobalSinks() {
  static absl::NoDestructor<GlobalLogSinkSet> global_sinks;
  return *global_sinks;
}